

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexToNFA.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
NFA::getClosure(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NFA *this,int indx)

{
  _Rb_tree_header *__last;
  int iVar1;
  _Rb_tree_color _Var2;
  int *piVar3;
  vector<int,std::allocator<int>> *pvVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  int *piVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  int it;
  queue<int,_std::deque<int,_std::allocator<int>_>_> que;
  set<int,_std::less<int>,_std::allocator<int>_> ret;
  int local_d0;
  int local_cc;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  vector<int,std::allocator<int>> *local_70;
  NFA *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  __last = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_cc = indx;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
  local_70 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_c8,&local_cc);
  }
  else {
    *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = indx;
    local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60,
             &local_cc);
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar1 = *local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_d0 = CONCAT31(local_d0._1_3_,0x2d);
      pmVar6 = std::
               map<char,_std::vector<int,_std::allocator<int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&(local_68->StatusStore).
                             super__Vector_base<Status,_std::allocator<Status>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1].Next,(key_type *)&local_d0);
      piVar3 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar8 = (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar3; piVar8 = piVar8 + 1) {
        local_d0 = *piVar8;
        p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &__last->_M_header;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00104580:
          if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_c8,&local_d0);
          }
          else {
            *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_d0;
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_d0);
        }
        else {
          do {
            p_Var9 = p_Var10;
            p_Var7 = p_Var5;
            _Var2 = p_Var7[1]._M_color;
            p_Var10 = p_Var7;
            if ((int)_Var2 < local_d0) {
              p_Var10 = p_Var9;
            }
            p_Var5 = (&p_Var7->_M_left)[(int)_Var2 < local_d0];
          } while ((&p_Var7->_M_left)[(int)_Var2 < local_d0] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var10 == __last) goto LAB_00104580;
          if ((int)_Var2 < local_d0) {
            p_Var7 = p_Var9;
          }
          if (local_d0 < (int)p_Var7[1]._M_color) goto LAB_00104580;
        }
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pvVar4 = local_70;
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            (local_70,(_Rb_tree_const_iterator<int>)
                      local_60._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)__last,(allocator_type *)&local_d0);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return (vector<int,_std::allocator<int>_> *)pvVar4;
}

Assistant:

vector<int> getClosure(int indx){
        set<int>ret;
        queue<int>que;
        que.push(indx);
        ret.insert(indx);
        while (!que.empty()){
            int c = que.front();
            que.pop();
            for(auto it:(StatusStore[c].Next[EPSILON])){
                if(!ret.count(it)){
                    que.push(it);
                    ret.insert(it);
                }
            }
        }
        return vector<int>(ret.begin(),ret.end());
    }